

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O2

int16_t mpack_node_i16(mpack_node_t node)

{
  ulong uVar1;
  mpack_node_data_t *pmVar2;
  
  pmVar2 = node.data;
  if ((node.tree)->error == mpack_ok) {
    if (pmVar2->type == mpack_type_int) {
      uVar1 = (pmVar2->value).i;
      if ((long)(short)uVar1 == uVar1) goto LAB_001049ad;
    }
    else if ((pmVar2->type == mpack_type_uint) && (uVar1 = (pmVar2->value).u, uVar1 < 0x8000))
    goto LAB_001049ad;
    mpack_tree_flag_error(node.tree,mpack_error_type);
    return 0;
  }
  uVar1 = 0;
LAB_001049ad:
  return (int16_t)uVar1;
}

Assistant:

MPACK_INLINE int16_t mpack_node_i16(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    if (node.data->type == mpack_type_uint) {
        if (node.data->value.u <= INT16_MAX)
            return (int16_t)node.data->value.u;
    } else if (node.data->type == mpack_type_int) {
        if (node.data->value.i >= INT16_MIN && node.data->value.i <= INT16_MAX)
            return (int16_t)node.data->value.i;
    }

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}